

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void flatbuffers::ForAllFields
               (Object *object,bool reverse,function<void_(const_reflection::Field_*)> *func)

{
  ushort uVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Object *pOVar6;
  Object *pOVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Object *local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(ushort *)(object + -(long)*(int *)object) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(object + (6 - (long)*(int *)object));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_58,(ulong)*(uint *)(object + (ulong)*(uint *)(object + uVar1) + (ulong)uVar1));
  uVar3 = 0;
  uVar4 = 0;
  while( true ) {
    lVar5 = -(long)*(int *)object;
    if (*(ushort *)(object + -(long)*(int *)object) < 7) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(object + lVar5 + 6);
    }
    if (*(uint *)(object + (ulong)*(uint *)(object + uVar1) + (ulong)uVar1) <= uVar4) break;
    if (*(ushort *)(object + -(long)*(int *)object) < 7) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(object + lVar5 + 6);
    }
    if (uVar1 == 0) {
      pOVar6 = (Object *)0x0;
    }
    else {
      pOVar6 = object + (ulong)*(uint *)(object + uVar1) + (ulong)uVar1;
    }
    if (*(uint *)pOVar6 <= uVar4) goto LAB_0015f086;
    lVar5 = (ulong)*(uint *)(pOVar6 + (ulong)uVar3 + 4) + (ulong)uVar3;
    pOVar7 = pOVar6 + lVar5 + 4;
    if (*(ushort *)(pOVar7 + -(long)*(int *)pOVar7) < 9) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(pOVar6 + ((lVar5 + 0xc) - (long)*(int *)pOVar7));
    }
    if (uVar1 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)*(ushort *)(pOVar7 + uVar1);
    }
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] = (uint)uVar4;
    uVar4 = uVar4 + 1;
    uVar3 = uVar3 + 4;
  }
  if ((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) goto LAB_0015f065;
  uVar4 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  lVar5 = 1;
  uVar8 = 0;
  while( true ) {
    if (*(ushort *)(object + -(long)*(int *)object) < 7) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(object + (6 - (long)*(int *)object));
    }
    if (uVar1 == 0) {
      pOVar6 = (Object *)0x0;
    }
    else {
      pOVar6 = object + (ulong)*(uint *)(object + uVar1) + (ulong)uVar1;
    }
    uVar4 = uVar4 + lVar5;
    if (!reverse) {
      uVar4 = uVar8;
    }
    if (*(uint *)pOVar6 <=
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4]) break;
    uVar4 = (ulong)(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar4] << 2);
    local_38 = pOVar6 + *(uint *)(pOVar6 + uVar4 + 4) + uVar4 + 4;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar2);
    }
    (*func->_M_invoker)((_Any_data *)func,(Field **)&local_38);
    uVar8 = uVar8 + 1;
    uVar4 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar5 = lVar5 + -1;
    if (uVar4 <= uVar8) {
LAB_0015f065:
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
LAB_0015f086:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,
                "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
               );
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                  std::function<void(const reflection::Field *)> func) {
  std::vector<uint32_t> field_to_id_map;
  field_to_id_map.resize(object->fields()->size());

  // Create the mapping of field ID to the index into the vector.
  for (uint32_t i = 0; i < object->fields()->size(); ++i) {
    auto field = object->fields()->Get(i);
    field_to_id_map[field->id()] = i;
  }

  for (size_t i = 0; i < field_to_id_map.size(); ++i) {
    func(object->fields()->Get(
        field_to_id_map[reverse ? field_to_id_map.size() - i + 1 : i]));
  }
}